

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kit.h
# Opt level: O2

int Kit_TruthIsConst1(uint *pIn,int nVars)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar2 = 1;
  }
  do {
    if ((int)uVar2 < 1) {
      return 1;
    }
    lVar1 = uVar2 - 1;
    uVar2 = uVar2 - 1;
  } while (pIn[lVar1] == 0xffffffff);
  return 0;
}

Assistant:

static inline int Kit_TruthIsConst1( unsigned * pIn, int nVars )
{
    int w;
    for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
        if ( pIn[w] != ~(unsigned)0 )
            return 0;
    return 1;
}